

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O0

void yang_print_refine(lyout *out,int level,lys_module *module,lys_refine *refine)

{
  char *value;
  char *str;
  int flag;
  int i;
  lys_refine *refine_local;
  lys_module *module_local;
  lyout *plStack_10;
  int level_local;
  lyout *out_local;
  
  str._0_4_ = 0;
  _flag = (lys_node *)refine;
  refine_local = (lys_refine *)module;
  module_local._4_4_ = level;
  plStack_10 = out;
  value = transform_json2schema(module,refine->target_name);
  ly_print(plStack_10,"%*srefine \"%s\"",(ulong)(uint)(module_local._4_4_ << 1),"",value);
  lydict_remove((ly_ctx *)refine_local->target_name,value);
  module_local._4_4_ = module_local._4_4_ + 1;
  yang_print_snode_common
            (plStack_10,module_local._4_4_,_flag,(lys_module *)refine_local,(int *)&str,3);
  for (str._4_4_ = 0; str._4_4_ < (int)(uint)_flag->padding[2]; str._4_4_ = str._4_4_ + 1) {
    yang_print_open(plStack_10,(int *)&str);
    yang_print_must(plStack_10,module_local._4_4_,(lys_module *)refine_local,
                    (lys_restr *)(*(long *)&_flag->nodetype + (long)str._4_4_ * 0x38));
  }
  if (*(short *)_flag->padding == 1) {
    yang_print_open(plStack_10,(int *)&str);
    yang_print_substmt(plStack_10,module_local._4_4_,LYEXT_SUBSTMT_PRESENCE,'\0',
                       (char *)_flag->child,(lys_module *)refine_local,_flag->ext,
                       (uint)_flag->ext_size);
  }
  for (str._4_4_ = 0; str._4_4_ < (int)(uint)_flag->padding[3]; str._4_4_ = str._4_4_ + 1) {
    yang_print_open(plStack_10,(int *)&str);
    yang_print_substmt(plStack_10,module_local._4_4_,LYEXT_SUBSTMT_DEFAULT,(uint8_t)str._4_4_,
                       *(char **)(_flag->parent->padding + (long)str._4_4_ * 8 + -0x1c),
                       (lys_module *)refine_local,_flag->ext,(uint)_flag->ext_size);
  }
  if ((_flag->flags & 1) == 0) {
    if ((_flag->flags & 2) != 0) {
      yang_print_open(plStack_10,(int *)&str);
      yang_print_substmt(plStack_10,module_local._4_4_,LYEXT_SUBSTMT_CONFIG,'\0',"false",
                         (lys_module *)refine_local,_flag->ext,(uint)_flag->ext_size);
    }
  }
  else {
    yang_print_open(plStack_10,(int *)&str);
    yang_print_substmt(plStack_10,module_local._4_4_,LYEXT_SUBSTMT_CONFIG,'\0',"true",
                       (lys_module *)refine_local,_flag->ext,(uint)_flag->ext_size);
  }
  if ((_flag->flags & 0x40) == 0) {
    if ((_flag->flags & 0x80) != 0) {
      yang_print_open(plStack_10,(int *)&str);
      yang_print_substmt(plStack_10,module_local._4_4_,LYEXT_SUBSTMT_MANDATORY,'\0',"false",
                         (lys_module *)refine_local,_flag->ext,(uint)_flag->ext_size);
    }
  }
  else {
    yang_print_open(plStack_10,(int *)&str);
    yang_print_substmt(plStack_10,module_local._4_4_,LYEXT_SUBSTMT_MANDATORY,'\0',"true",
                       (lys_module *)refine_local,_flag->ext,(uint)_flag->ext_size);
  }
  if ((*(ushort *)_flag->padding & 0x18) != 0) {
    if ((_flag->flags & 0x10) != 0) {
      yang_print_open(plStack_10,(int *)&str);
      yang_print_unsigned(plStack_10,module_local._4_4_,LYEXT_SUBSTMT_MIN,'\0',
                          (lys_module *)refine_local,_flag->ext,(uint)_flag->ext_size,
                          *(uint *)&_flag->child);
    }
    if ((_flag->flags & 8) != 0) {
      yang_print_open(plStack_10,(int *)&str);
      if (*(int *)((long)&_flag->child + 4) == 0) {
        yang_print_substmt(plStack_10,module_local._4_4_,LYEXT_SUBSTMT_MAX,'\0',"unbounded",
                           (lys_module *)refine_local,_flag->ext,(uint)_flag->ext_size);
      }
      else {
        yang_print_unsigned(plStack_10,module_local._4_4_,LYEXT_SUBSTMT_MAX,'\0',
                            (lys_module *)refine_local,_flag->ext,(uint)_flag->ext_size,
                            *(uint *)((long)&_flag->child + 4));
      }
    }
  }
  yang_print_snode_common
            (plStack_10,module_local._4_4_,_flag,(lys_module *)refine_local,(int *)&str,0x60);
  module_local._4_4_ = module_local._4_4_ + -1;
  yang_print_close(plStack_10,module_local._4_4_,(int)str);
  return;
}

Assistant:

static void
yang_print_refine(struct lyout *out, int level, const struct lys_module *module, const struct lys_refine *refine)
{
    int i, flag = 0;
    const char *str;

    str = transform_json2schema(module, refine->target_name);
    ly_print(out, "%*srefine \"%s\"", LEVEL, INDENT, str);
    lydict_remove(module->ctx, str);
    level++;

    yang_print_snode_common(out, level, (struct lys_node *)refine, module, &flag, SNODE_COMMON_EXT | SNODE_COMMON_IFF);
    for (i = 0; i < refine->must_size; ++i) {
        yang_print_open(out, &flag);
        yang_print_must(out, level, module, &refine->must[i]);
    }
    if (refine->target_type == LYS_CONTAINER) {
        yang_print_open(out, &flag);
        yang_print_substmt(out, level, LYEXT_SUBSTMT_PRESENCE, 0, refine->mod.presence,
                           module, refine->ext, refine->ext_size);
    }
    for (i = 0; i < refine->dflt_size; ++i) {
        yang_print_open(out, &flag);
        yang_print_substmt(out, level, LYEXT_SUBSTMT_DEFAULT, i, refine->dflt[i], module, refine->ext, refine->ext_size);
    }
    if (refine->flags & LYS_CONFIG_W) {
        yang_print_open(out, &flag);
        yang_print_substmt(out, level, LYEXT_SUBSTMT_CONFIG, 0, "true", module, refine->ext, refine->ext_size);
    } else if (refine->flags & LYS_CONFIG_R) {
        yang_print_open(out, &flag);
        yang_print_substmt(out, level, LYEXT_SUBSTMT_CONFIG, 0, "false", module, refine->ext, refine->ext_size);
    }
    if (refine->flags & LYS_MAND_TRUE) {
        yang_print_open(out, &flag);
        yang_print_substmt(out, level, LYEXT_SUBSTMT_MANDATORY, 0, "true", module, refine->ext, refine->ext_size);
    } else if (refine->flags & LYS_MAND_FALSE) {
        yang_print_open(out, &flag);
        yang_print_substmt(out, level, LYEXT_SUBSTMT_MANDATORY, 0, "false", module, refine->ext, refine->ext_size);
    }
    if (refine->target_type & (LYS_LIST | LYS_LEAFLIST)) {
        if (refine->flags & LYS_RFN_MINSET) {
            yang_print_open(out, &flag);
            yang_print_unsigned(out, level, LYEXT_SUBSTMT_MIN, 0, module, refine->ext, refine->ext_size,
                                refine->mod.list.min);
        }
        if (refine->flags & LYS_RFN_MAXSET) {
            yang_print_open(out, &flag);
            if (refine->mod.list.max) {
                yang_print_unsigned(out, level, LYEXT_SUBSTMT_MAX, 0, module, refine->ext, refine->ext_size,
                                    refine->mod.list.max);
            } else {
                yang_print_substmt(out, level, LYEXT_SUBSTMT_MAX, 0, "unbounded", module, refine->ext, refine->ext_size);
            }
        }
    }
    yang_print_snode_common(out, level, (struct lys_node *)refine, module, &flag, SNODE_COMMON_DSC | SNODE_COMMON_REF);

    level--;
    yang_print_close(out, level, flag);
}